

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

bool __thiscall CConnman::DisconnectNode(CConnman *this,CNetAddr *addr)

{
  bool bVar1;
  long in_FS_OFFSET;
  direct_or_indirect local_50;
  uint local_40;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  CSubNet::CSubNet((CSubNet *)&local_50.indirect_contents,addr);
  bVar1 = DisconnectNode(this,(CSubNet *)&local_50.indirect_contents);
  if (0x10 < local_40) {
    free(local_50.indirect_contents.indirect);
    local_50.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CConnman::DisconnectNode(const CNetAddr& addr)
{
    return DisconnectNode(CSubNet(addr));
}